

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O1

void __thiscall sznet::net::Connector::~Connector(Connector *this)

{
  _Atomic_word *p_Var1;
  char *pcVar2;
  _Manager_type p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  int iVar5;
  LogStream *pLVar6;
  char **ppcVar7;
  SourceFile file;
  Logger local_fe0;
  
  if (g_logLevel < 2) {
    file._8_8_ = 0xd;
    file.m_data = "Connector.cpp";
    Logger::Logger(&local_fe0,file,0x1e,DEBUG,"~Connector");
    if (5 < (uint)((int)&local_fe0.m_impl.m_stream.m_buffer.m_cur -
                  (int)local_fe0.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_fe0.m_impl.m_stream.m_buffer.m_cur,"dtor[",5);
      local_fe0.m_impl.m_stream.m_buffer.m_cur = local_fe0.m_impl.m_stream.m_buffer.m_cur + 5;
    }
    pLVar6 = LogStream::operator<<(&local_fe0.m_impl.m_stream,this);
    ppcVar7 = &(pLVar6->m_buffer).m_cur;
    pcVar2 = (pLVar6->m_buffer).m_cur;
    if (((int)ppcVar7 - (int)pcVar2 & 0xfffffffeU) != 0) {
      *pcVar2 = ']';
      *ppcVar7 = *ppcVar7 + 1;
    }
    Logger::~Logger(&local_fe0);
  }
  if ((this->m_channel)._M_t.
      super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>._M_t.
      super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>.
      super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl == (Channel *)0x0) {
    p_Var3 = (this->m_newConnectionCallback).super__Function_base._M_manager;
    if (p_Var3 != (_Manager_type)0x0) {
      (*p_Var3)((_Any_data *)&this->m_newConnectionCallback,
                (_Any_data *)&this->m_newConnectionCallback,__destroy_functor);
    }
    std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::~unique_ptr
              (&this->m_channel);
    p_Var4 = (this->super_enable_shared_from_this<sznet::net::Connector>)._M_weak_this.
             super___weak_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &p_Var4->_M_weak_count;
        iVar5 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar5 = p_Var4->_M_weak_count;
        p_Var4->_M_weak_count = iVar5 + -1;
      }
      if (iVar5 == 1) {
        (*p_Var4->_vptr__Sp_counted_base[3])();
      }
    }
    return;
  }
  __assert_fail("!m_channel",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Connector.cpp"
                ,0x1f,"sznet::net::Connector::~Connector()");
}

Assistant:

Connector::~Connector()
{
	LOG_DEBUG << "dtor[" << this << "]";
	assert(!m_channel);
}